

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManPrintControlFanouts(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pObj_01;
  Aig_Obj_t *pObj_02;
  Aig_Obj_t *pObj_03;
  int local_34;
  int i;
  Aig_Obj_t *pCtrl;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Aig_Obj_t *pObj;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  pObj_00 = Aig_ManCi(p,iVar1 + -1);
  printf("Control signal:\n");
  Aig_ObjPrint(p,pObj_00);
  printf("\n\n");
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= local_34) {
      return;
    }
    pObj_01 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_34);
    if ((pObj_01 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pObj_01), iVar1 != 0)) {
      if (pObj_01 == pObj_00) {
        __assert_fail("pObj != pCtrl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigUtil.c"
                      ,0x41e,"void Aig_ManPrintControlFanouts(Aig_Man_t *)");
      }
      pObj_02 = Aig_ObjFanin0(pObj_01);
      pObj_03 = Aig_ObjFanin1(pObj_01);
      if ((pObj_02 == pObj_00) && (iVar1 = Aig_ObjIsCi(pObj_03), iVar1 != 0)) {
        Aig_ObjPrint(p,pObj_01);
        printf("\n");
        Aig_ObjPrint(p,pObj_03);
        printf("\n");
        printf("\n");
      }
      if ((pObj_03 == pObj_00) && (iVar1 = Aig_ObjIsCi(pObj_02), iVar1 != 0)) {
        Aig_ObjPrint(p,pObj_01);
        printf("\n");
        Aig_ObjPrint(p,pObj_02);
        printf("\n");
        printf("\n");
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Aig_ManPrintControlFanouts( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pFanin0, * pFanin1, * pCtrl;
    int i;

    pCtrl = Aig_ManCi( p, Aig_ManCiNum(p) - 1 );

    printf( "Control signal:\n" );
    Aig_ObjPrint( p, pCtrl ); printf( "\n\n" );

    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) )
            continue;
        assert( pObj != pCtrl );
        pFanin0 = Aig_ObjFanin0(pObj);
        pFanin1 = Aig_ObjFanin1(pObj);
        if ( pFanin0 == pCtrl && Aig_ObjIsCi(pFanin1) )
        {
            Aig_ObjPrint( p, pObj ); printf( "\n" );
            Aig_ObjPrint( p, pFanin1 ); printf( "\n" );
            printf( "\n" );
        }
        if ( pFanin1 == pCtrl && Aig_ObjIsCi(pFanin0) )
        {
            Aig_ObjPrint( p, pObj ); printf( "\n" );
            Aig_ObjPrint( p, pFanin0 ); printf( "\n" );
            printf( "\n" );
        }
    }
}